

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_2::PtexUtils::average
               (void *src,int sstride,int uw,int vw,void *dst,DataType dt,int nchan)

{
  switch(dt) {
  case dt_uint8:
    anon_unknown_1::average<unsigned_char>((uchar *)src,sstride,uw,vw,(uchar *)dst,nchan);
    return;
  case dt_uint16:
    anon_unknown_1::average<unsigned_short>
              ((unsigned_short *)src,sstride,uw,vw,(unsigned_short *)dst,nchan);
    return;
  case dt_half:
    anon_unknown_1::average<Ptex::v2_2::PtexHalf>
              ((PtexHalf *)src,sstride,uw,vw,(PtexHalf *)dst,nchan);
    return;
  case dt_float:
    anon_unknown_1::average<float>((float *)src,sstride,uw,vw,(float *)dst,nchan);
    return;
  default:
    return;
  }
}

Assistant:

void average(const void* src, int sstride, int uw, int vw,
             void* dst, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     average(static_cast<const uint8_t*>(src), sstride, uw, vw,
                               static_cast<uint8_t*>(dst), nchan); break;
    case dt_half:      average(static_cast<const PtexHalf*>(src), sstride, uw, vw,
                               static_cast<PtexHalf*>(dst), nchan); break;
    case dt_uint16:    average(static_cast<const uint16_t*>(src), sstride, uw, vw,
                               static_cast<uint16_t*>(dst), nchan); break;
    case dt_float:     average(static_cast<const float*>(src), sstride, uw, vw,
                               static_cast<float*>(dst), nchan); break;
    }
}